

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O3

void __thiscall QPushButton::focusInEvent(QPushButton *this,QFocusEvent *e)

{
  byte bVar1;
  QPushButtonPrivate *this_00;
  int iVar2;
  QDialog *pQVar3;
  long lVar4;
  
  lVar4 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  iVar2 = QFocusEvent::reason();
  if (iVar2 != 4) {
    this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    bVar1 = this_00->field_0x2c8;
    if ((bVar1 & 3) != 0) {
      if ((bVar1 & 3) == 2) {
        pQVar3 = QPushButtonPrivate::dialogParent(this_00);
        if (pQVar3 == (QDialog *)0x0) goto LAB_0046b10b;
      }
      bVar1 = *(byte *)(lVar4 + 0x2c8);
      if ((bVar1 & 4) == 0) {
        *(byte *)(lVar4 + 0x2c8) = bVar1 | 4;
        QWidget::window((QWidget *)this);
        lVar4 = QMetaObject::cast((QObject *)&QDialog::staticMetaObject);
        if (lVar4 != 0) {
          QDialogPrivate::setDefault(*(QDialogPrivate **)(lVar4 + 8),this);
        }
      }
    }
  }
LAB_0046b10b:
  QAbstractButton::focusInEvent(&this->super_QAbstractButton,e);
  return;
}

Assistant:

void QPushButton::focusInEvent(QFocusEvent *e)
{
    Q_D(QPushButton);
    if (e->reason() != Qt::PopupFocusReason && autoDefault() && !d->defaultButton) {
        d->defaultButton = true;
#if QT_CONFIG(dialog)
        QDialog *dlg = qobject_cast<QDialog*>(window());
        if (dlg)
            dlg->d_func()->setDefault(this);
#endif
    }
    QAbstractButton::focusInEvent(e);
}